

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O2

string * __thiscall
testing::internal::
FormatForComparisonFailureMessage<TApp_NewEnumTest_Test::TestBody()::Level2,TApp_NewEnumTest_Test::TestBody()::Level2>
          (string *__return_storage_ptr__,internal *this,Level2 *value,Level2 *param_2)

{
  stringstream ss;
  ostream local_188 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  internal2::PrintBytesInObjectTo((uchar *)this,4,local_188);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return __return_storage_ptr__;
}

Assistant:

std::string FormatForComparisonFailureMessage(
    const T1& value, const T2& /* other_operand */) {
  return FormatForComparison<T1, T2>::Format(value);
}